

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-dda-dump.cpp
# Opt level: O3

void __thiscall
MemorySSADumper::dumpDDIMap(MemorySSADumper *this,DefinitionsMap<dg::dda::RWNode> *map)

{
  undefined8 *puVar1;
  RWNode *node;
  _Base_ptr p_Var2;
  _Rb_tree_node_base *p_Var3;
  _Rb_tree_node_base *p_Var4;
  
  p_Var2 = dg::Offset::UNKNOWN;
  for (puVar1 = *(undefined8 **)&map->field_0x10; puVar1 != (undefined8 *)0x0;
      puVar1 = (undefined8 *)*puVar1) {
    for (p_Var4 = (_Rb_tree_node_base *)puVar1[5]; p_Var4 != (_Rb_tree_node_base *)(puVar1 + 3);
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      printf("<tr><td align=\"left\" colspan=\"4\">");
      Dumper::printName(&this->super_Dumper,(RWNode *)puVar1[1]);
      printf("</td></tr>");
      for (p_Var3 = p_Var4[2]._M_parent; p_Var3 != (_Rb_tree_node_base *)&p_Var4[1]._M_right;
          p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
        node = *(RWNode **)(p_Var3 + 1);
        printf("<tr><td>&nbsp;&nbsp;</td><td>");
        if (*(_Base_ptr *)(p_Var4 + 1) == p_Var2) {
          printf("[? - ");
        }
        else {
          printf("[%lu - ");
        }
        if (p_Var4[1]._M_parent == p_Var2) {
          printf("?]");
        }
        else {
          printf("%lu]");
        }
        printf("</td><td>@</td><td>");
        Dumper::printName(&this->super_Dumper,node);
        puts("</td></tr>");
      }
    }
  }
  return;
}

Assistant:

void dumpDDIMap(const DefinitionsMap<RWNode> &map) {
        for (const auto &it : map) {
            for (const auto &it2 : it.second) {
                printf(R"(<tr><td align="left" colspan="4">)");
                printName(it.first);
                printf("</td></tr>");
                for (auto *where : it2.second) {
                    printf("<tr><td>&nbsp;&nbsp;</td><td>");
                    printInterval(it2.first);
                    printf("</td><td>@</td><td>");
                    printName(where);
                    puts("</td></tr>");
                }
            }
        }
    }